

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Opnd * Lowerer::GetMissingItemOpndForAssignment(IRType type,Func *func)

{
  ushort uVar1;
  Func *pFVar2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  bool bVar6;
  uint sourceContextId;
  uint functionId;
  Opnd *pOVar7;
  JITTimeFunctionBody *this;
  FunctionJITTimeInfo *this_00;
  undefined7 extraout_var;
  LabelInstr *helperLabel;
  undefined4 *puVar8;
  RegOpnd *pRVar9;
  AddrOpnd *pAVar10;
  IndirOpnd *pIVar11;
  undefined8 extraout_RAX;
  undefined7 uVar16;
  RegOpnd *pRVar12;
  IntConstOpnd *pIVar13;
  intptr_t iVar14;
  MemRefOpnd *pMVar15;
  intptr_t in_RCX;
  ArrayCallSiteInfo *arrayInfo;
  ArrayCallSiteInfo *arrayInfo_00;
  ArrayCallSiteInfo *arrayInfo_01;
  LabelInstr *unaff_RBX;
  bool unaff_BPL;
  Func *instr;
  undefined7 in_register_00000039;
  Lowerer *this_01;
  intptr_t in_R8;
  uint in_R9D;
  uint uVar17;
  int iVar18;
  uint uStack_50;
  bool bStack_49;
  Func *pFStack_48;
  
  this_01 = (Lowerer *)CONCAT71(in_register_00000039,type);
  iVar18 = (int)this_01;
  if (iVar18 == 0x17) {
LAB_005ca9ee:
    pOVar7 = GetMissingItemOpnd(type,func);
    return pOVar7;
  }
  if (iVar18 == 10) {
    iVar14 = ThreadContextInfo::GetNativeFloatArrayMissingItemAddr(func->m_threadContextInfo);
    pMVar15 = IR::MemRefOpnd::New(iVar14,TyFloat64,func,AddrOpndKindDynamicMisc);
    return &pMVar15->super_Opnd;
  }
  if (iVar18 == 3) goto LAB_005ca9ee;
  instr = func;
  GetMissingItemOpndForAssignment();
  pFStack_48 = func;
  this = JITTimeWorkItem::GetJITFunctionBody(this_01->m_func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this);
  this_00 = JITTimeWorkItem::GetJITTimeInfo(this_01->m_func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_00);
  bVar4 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015bbe90,ArrayCtorFastPathPhase,sourceContextId,functionId);
  uVar16 = extraout_var;
  if (bVar4) goto LAB_005caca7;
  pFVar2 = this_01->m_func;
  helperLabel = IR::LabelInstr::New(Label,pFVar2,true);
  bStack_49 = false;
  pRVar9 = (RegOpnd *)instr->pinnedTypeRefs;
  uStack_50 = in_R9D;
  OVar5 = IR::Opnd::GetKind((Opnd *)pRVar9);
  if (OVar5 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar6) goto LAB_005caf01;
    *puVar8 = 0;
  }
  if (*(char *)((long)&instr->constructorCaches + 1) != '\x04') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
    if (!bVar6) {
LAB_005caf01:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar8 = 0;
  }
  if (arrayInfo == (ArrayCallSiteInfo *)0x0) {
LAB_005cabee:
    pRVar9 = GenerateArrayAllocHelper<Js::JavascriptArray>
                       (this_01,(Instr *)instr,&uStack_50,arrayInfo,&bStack_49,true,unaff_BPL);
    if (uStack_50 != 0) {
      uVar17 = 0;
      iVar18 = 0x18;
      do {
        pAVar10 = IR::AddrOpnd::New(&DAT_40002fff80002,AddrOpndKindConstantAddress,this_01->m_func,
                                    true,(Var)0x0);
        pIVar11 = IR::IndirOpnd::New(pRVar9,iVar18,(pAVar10->super_Opnd).m_type,this_01->m_func,
                                     false);
        InsertMove(&pIVar11->super_Opnd,&pAVar10->super_Opnd,(Instr *)instr,true);
        uVar17 = uVar17 + 1;
        iVar18 = iVar18 + 8;
      } while (uVar17 < uStack_50);
    }
  }
  else {
    uVar1 = *(ushort *)&instr->propertyGuardsByPropertyId;
    if ((((arrayInfo->field_0).bits & 1) != 0) ||
       (bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,NativeArrayPhase), bVar6)) {
      if ((((arrayInfo->field_0).bits & 2) != 0) ||
         (bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,NativeArrayPhase), bVar6))
      goto LAB_005cabee;
      GenerateArrayInfoIsNativeFloatAndNotIntArrayTest
                (this_01,(Instr *)instr,arrayInfo_01,in_RCX,helperLabel);
      pRVar12 = GenerateArrayAllocHelper<Js::JavascriptNativeFloatArray>
                          (this_01,(Instr *)instr,&uStack_50,arrayInfo,&bStack_49,true,unaff_BPL);
      pIVar13 = IR::IntConstOpnd::New((ulong)uVar1,TyUint16,pFVar2,true);
      uVar17 = 0;
      pIVar11 = IR::IndirOpnd::New(pRVar9,0x1a,(pIVar13->super_Opnd).m_type,this_01->m_func,false);
      InsertMove(&pIVar11->super_Opnd,&pIVar13->super_Opnd,(Instr *)instr,true);
      pAVar10 = IR::AddrOpnd::New(in_R8,AddrOpndKindDynamicFunctionBodyWeakRef,this_01->m_func,false
                                  ,(Var)0x0);
      pIVar11 = IR::IndirOpnd::New(pRVar9,0x38,(pAVar10->super_Opnd).m_type,this_01->m_func,false);
      InsertMove(&pIVar11->super_Opnd,&pAVar10->super_Opnd,(Instr *)instr,true);
      if (uStack_50 != 0) {
        iVar18 = 0x18;
        do {
          pFVar2 = this_01->m_func;
          iVar14 = ThreadContextInfo::GetNativeFloatArrayMissingItemAddr
                             (pFVar2->m_threadContextInfo);
          pMVar15 = IR::MemRefOpnd::New(iVar14,TyFloat64,pFVar2,AddrOpndKindDynamicMisc);
          pIVar11 = IR::IndirOpnd::New(pRVar12,iVar18,(pMVar15->super_Opnd).m_type,this_01->m_func,
                                       false);
          InsertMove(&pIVar11->super_Opnd,&pMVar15->super_Opnd,(Instr *)instr,true);
          uVar17 = uVar17 + 1;
          iVar18 = iVar18 + 8;
        } while (uVar17 < uStack_50);
      }
    }
    else {
      GenerateArrayInfoIsNativeIntArrayTest(this_01,(Instr *)instr,arrayInfo_00,in_RCX,helperLabel);
      pRVar12 = GenerateArrayAllocHelper<Js::JavascriptNativeIntArray>
                          (this_01,(Instr *)instr,&uStack_50,arrayInfo,&bStack_49,true,unaff_BPL);
      pIVar13 = IR::IntConstOpnd::New((ulong)uVar1,TyUint16,pFVar2,true);
      uVar17 = 0;
      pIVar11 = IR::IndirOpnd::New(pRVar9,0x1a,(pIVar13->super_Opnd).m_type,this_01->m_func,false);
      InsertMove(&pIVar11->super_Opnd,&pIVar13->super_Opnd,(Instr *)instr,true);
      pAVar10 = IR::AddrOpnd::New(in_R8,AddrOpndKindDynamicFunctionBodyWeakRef,this_01->m_func,false
                                  ,(Var)0x0);
      pIVar11 = IR::IndirOpnd::New(pRVar9,0x38,(pAVar10->super_Opnd).m_type,this_01->m_func,false);
      InsertMove(&pIVar11->super_Opnd,&pAVar10->super_Opnd,(Instr *)instr,true);
      if (uStack_50 != 0) {
        iVar18 = 0x18;
        do {
          GenerateMemInit(this_01,pRVar12,iVar18,-0x7fffe,(Instr *)instr,bStack_49);
          uVar17 = uVar17 + 1;
          iVar18 = iVar18 + 4;
        } while (uVar17 < uStack_50);
      }
    }
  }
  InsertBranch(Br,false,unaff_RBX,(Instr *)instr);
  IR::Instr::InsertBefore((Instr *)instr,&helperLabel->super_Instr);
  uVar16 = (undefined7)((ulong)extraout_RAX >> 8);
LAB_005caca7:
  return (Opnd *)(CONCAT71(uVar16,bVar4) ^ 1);
}

Assistant:

IR::Opnd*
Lowerer::GetMissingItemOpndForAssignment(IRType type, Func *func)
{
    switch (type)
    {
    case TyVar:
    case TyInt32:
        return GetMissingItemOpnd(type, func);

    case TyFloat64:
        return IR::MemRefOpnd::New(func->GetThreadContextInfo()->GetNativeFloatArrayMissingItemAddr(), TyFloat64, func);

    default:
        AnalysisAssertMsg(false, "Unexpected type in Lowerer::GetMissingItemOpndForAssignment");
        __assume(false);
    }
}